

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O0

iter __thiscall riffcpp::Chunk::begin(Chunk *this,bool no_chunk_id)

{
  long lVar1;
  impl *this_00;
  byte in_DL;
  undefined7 in_register_00000031;
  long *plVar2;
  fpos<__mbstate_t> fVar3;
  streamoff local_50;
  __mbstate_t local_48;
  impl *it;
  streamoff offs;
  bool no_chunk_id_local;
  Chunk *this_local;
  
  plVar2 = (long *)CONCAT71(in_register_00000031,no_chunk_id);
  this_00 = (impl *)operator_new(0x30);
  (this_00->m_limit)._M_off = 0;
  (this_00->m_limit)._M_state.__count = 0;
  (this_00->m_limit)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (this_00->m_pos)._M_off = 0;
  (this_00->m_pos)._M_state.__count = 0;
  (this_00->m_pos)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (this_00->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this_00->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iterator::impl::impl(this_00);
  fVar3 = std::fpos<__mbstate_t>::operator+
                    ((fpos<__mbstate_t> *)(*plVar2 + 0x20),(ulong)((byte)~(in_DL & 1) & 1) * 4 + 8);
  local_50 = fVar3._M_off;
  (this_00->m_pos)._M_off = local_50;
  local_48 = fVar3._M_state;
  (this_00->m_pos)._M_state = local_48;
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::operator=
            ((shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> *)this_00,
             (shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> *)*plVar2);
  lVar1 = *plVar2;
  (this_00->m_limit)._M_off = *(streamoff *)(lVar1 + 0x30);
  (this_00->m_limit)._M_state = *(__mbstate_t *)(lVar1 + 0x38);
  iterator::iterator((iterator *)this,this_00);
  return (iter)(impl *)this;
}

Assistant:

iter riffcpp::Chunk::begin(bool no_chunk_id) {
  std::streamoff offs{no_chunk_id ? 8 : 12};
  auto it = new riffcpp::Chunk::iterator::impl();
  it->m_pos = pimpl->m_pos + offs;
  it->m_stream = pimpl->m_stream;
  it->m_limit = pimpl->m_limit;

  return iter{it};
}